

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
::rebalance_left_to_right
          (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
          *right,allocator_type *alloc)

{
  undefined8 *puVar1;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  bVar2;
  undefined8 uVar3;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *pbVar4;
  ulong uVar5;
  ulong uVar6;
  char *__function;
  long lVar7;
  int i;
  long lVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  slot_type<S2CellId,_S2PointIndex<int>::PointData> *local_38;
  
  if ((((ulong)this & 7) != 0) || (((ulong)right & 7) != 0)) {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
    goto LAB_001bb233;
  }
  if (*(long *)this != *(long *)right) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x627,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x628,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  bVar2 = right[10];
  if ((byte)this[10] < (byte)bVar2) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x629,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  if (to_move < 1) {
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62a,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  if ((uint)(byte)this[10] < (uint)to_move) {
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62b,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  if ((uint)(byte)bVar2 < (uint)to_move) {
    uninitialized_move_n(right,(ulong)(byte)bVar2,0,(ulong)(uint)to_move,right,alloc);
    if ((*(ulong *)this & 7) == 0) {
      local_38 = (slot_type<S2CellId,_S2PointIndex<int>::PointData> *)
                 (*(ulong *)this + (ulong)(byte)this[8] * 0x28 + 0x10);
      btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
      ::value_init<absl::container_internal::slot_type<S2CellId,S2PointIndex<int>::PointData>*>
                ((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                  *)right,(ulong)(to_move - 1U),alloc,&local_38);
      bVar2 = right[10];
      lVar8 = (long)(int)(~(uint)(byte)bVar2 + to_move);
      uninitialized_move_n(this,lVar8,(ulong)(byte)this[10] - lVar8,(ulong)(byte)bVar2,right,alloc);
      if ((ulong)(byte)bVar2 != 0) {
        bVar2 = this[10];
        lVar7 = 0x10;
        do {
          pbVar4 = this + lVar7 + (ulong)(byte)bVar2 * 0x28 + (long)(int)(to_move - 1U) * -0x28;
          *(undefined8 *)(right + lVar7) = *(undefined8 *)pbVar4;
          *(undefined4 *)(right + lVar7 + 8) = *(undefined4 *)(pbVar4 + 8);
          uVar3 = *(undefined8 *)(pbVar4 + 0x18);
          *(undefined8 *)(right + lVar7 + 0x10) = *(undefined8 *)(pbVar4 + 0x10);
          *(undefined8 *)(right + lVar7 + 0x10 + 8) = uVar3;
          *(undefined8 *)(right + lVar7 + 0x20) = *(undefined8 *)(pbVar4 + 0x20);
          lVar7 = lVar7 + 0x28;
        } while (pbVar4 + 0x28 != this + ((ulong)(byte)bVar2 - lVar8) * 0x28 + 0x10);
      }
LAB_001bb12c:
      uVar5 = *(ulong *)this;
      if ((uVar5 & 7) == 0) {
        uVar6 = (ulong)(byte)this[8];
        lVar8 = (ulong)(byte)this[10] - (long)to_move;
        *(undefined8 *)(uVar5 + 0x10 + uVar6 * 0x28) = *(undefined8 *)(this + lVar8 * 0x28 + 0x10);
        *(undefined4 *)(uVar5 + 0x18 + uVar6 * 0x28) = *(undefined4 *)(this + lVar8 * 0x28 + 0x18);
        *(undefined8 *)(uVar5 + 0x30 + uVar6 * 0x28) = *(undefined8 *)(this + lVar8 * 0x28 + 0x30);
        uVar3 = *(undefined8 *)(this + lVar8 * 0x28 + 0x20 + 8);
        puVar1 = (undefined8 *)(uVar5 + 0x20 + uVar6 * 0x28);
        *puVar1 = *(undefined8 *)(this + lVar8 * 0x28 + 0x20);
        puVar1[1] = uVar3;
        if (this[0xb] ==
            (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
             )0x0) {
          uVar9 = (uint)(byte)right[10];
          do {
            pbVar4 = child(right,uVar9);
            init_child(right,to_move + uVar9,pbVar4);
            mutable_child(right,uVar9);
            bVar11 = uVar9 != 0;
            uVar9 = uVar9 - 1;
          } while (bVar11);
          iVar10 = 1 - to_move;
          i = 0;
          do {
            pbVar4 = child(this,(uint)(byte)this[10] + iVar10);
            init_child(right,i,pbVar4);
            mutable_child(this,(uint)(byte)this[10] + iVar10);
            iVar10 = iVar10 + 1;
            i = i + 1;
          } while (iVar10 != 1);
        }
        this[10] = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                    )((char)this[10] - (char)to_move);
        right[10] = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                     )((char)right[10] + (char)to_move);
        return;
      }
    }
  }
  else {
    uninitialized_move_n
              (right,(ulong)(uint)to_move,(long)(int)((uint)(byte)bVar2 - to_move),
               (ulong)(byte)bVar2,right,alloc);
    uVar9 = ~to_move + (uint)(byte)right[10];
    if (-1 < (int)uVar9) {
      uVar5 = (ulong)uVar9 * 0x28 + 0x38;
      pbVar4 = right + (ulong)(byte)right[10] * 0x28 + -8;
      do {
        *(undefined8 *)(pbVar4 + -0x10) = *(undefined8 *)(right + (uVar5 - 0x28));
        *(undefined4 *)(pbVar4 + -8) = *(undefined4 *)(right + (uVar5 - 0x20));
        uVar3 = *(undefined8 *)(right + (uVar5 - 0x18) + 8);
        *(undefined8 *)pbVar4 = *(undefined8 *)(right + (uVar5 - 0x18));
        *(undefined8 *)(pbVar4 + 8) = uVar3;
        *(undefined8 *)(pbVar4 + 0x10) = *(undefined8 *)(right + (uVar5 - 8));
        uVar5 = uVar5 - 0x28;
        pbVar4 = pbVar4 + -0x28;
      } while (0x37 < uVar5);
    }
    uVar5 = *(ulong *)this;
    if ((uVar5 & 7) == 0) {
      uVar6 = (ulong)(byte)this[8];
      lVar8 = (long)to_move + -1;
      lVar7 = (long)(int)lVar8;
      *(undefined8 *)(right + lVar7 * 0x28 + 0x10) = *(undefined8 *)(uVar5 + 0x10 + uVar6 * 0x28);
      *(undefined4 *)(right + lVar7 * 0x28 + 0x18) = *(undefined4 *)(uVar5 + 0x18 + uVar6 * 0x28);
      *(undefined8 *)(right + lVar7 * 0x28 + 0x30) = *(undefined8 *)(uVar5 + 0x30 + uVar6 * 0x28);
      puVar1 = (undefined8 *)(uVar5 + 0x20 + uVar6 * 0x28);
      uVar3 = puVar1[1];
      *(undefined8 *)(right + lVar7 * 0x28 + 0x20) = *puVar1;
      *(undefined8 *)(right + lVar7 * 0x28 + 0x20 + 8) = uVar3;
      if (lVar8 != 0) {
        bVar2 = this[10];
        lVar8 = 0x10;
        do {
          pbVar4 = this + lVar8 + (ulong)(byte)bVar2 * 0x28 + lVar7 * -0x28;
          *(undefined8 *)(right + lVar8) = *(undefined8 *)pbVar4;
          *(undefined4 *)(right + lVar8 + 8) = *(undefined4 *)(pbVar4 + 8);
          uVar3 = *(undefined8 *)(pbVar4 + 0x18);
          *(undefined8 *)(right + lVar8 + 0x10) = *(undefined8 *)(pbVar4 + 0x10);
          *(undefined8 *)(right + lVar8 + 0x10 + 8) = uVar3;
          *(undefined8 *)(right + lVar8 + 0x20) = *(undefined8 *)(pbVar4 + 0x20);
          lVar8 = lVar8 + 0x28;
        } while (pbVar4 + 0x28 != this + (ulong)(byte)bVar2 * 0x28 + 0x10);
      }
      goto LAB_001bb12c;
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
  ;
LAB_001bb233:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(count() >= right->count());
  assert(to_move >= 1);
  assert(to_move <= count());

  // Values in the right node are shifted to the right to make room for the
  // new to_move values. Then, the delimiting value in the parent and the
  // other (to_move - 1) values in the left node are moved into the right node.
  // Lastly, a new delimiting value is moved from the left node into the
  // parent, and the remaining empty left node entries are destroyed.

  if (right->count() >= to_move) {
    // The original location of the right->count() values are sufficient to hold
    // the new to_move entries from the parent and left node.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(to_move, right->count() - to_move,
                                right->count(), right, alloc);
    for (slot_type *src = right->slot(right->count() - to_move - 1),
                   *dest = right->slot(right->count() - 1),
                   *end = right->slot(0);
         src >= end; --src, --dest) {
      slot_type::move(alloc, src, dest);
    }

    // 2) Move the delimiting value in the parent to the right node.
    slot_type::move(alloc, parent()->slot(position()),
                    right->slot(to_move - 1));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    slot_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                    right->slot(0));
  } else {
    // The right node does not have enough initialized space to hold the new
    // to_move entries, so part of them will move to uninitialized space.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

    // 2) Move the delimiting value in the parent to the right node.
    right->value_init(to_move - 1, alloc, parent()->slot(position()));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    const size_type uninitialized_remaining = to_move - right->count() - 1;
    uninitialized_move_n(uninitialized_remaining,
                         count() - uninitialized_remaining, right->count(),
                         right, alloc);
    slot_type::move(alloc, slot(count() - (to_move - 1)),
                    slot(count() - uninitialized_remaining), right->slot(0));
  }

  // 4) Move the new delimiting value to the parent from the left node.
  slot_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

  // 5) Destroy the now-empty to_move entries in the left node.
  value_destroy_n(count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the left to the right node.
    for (int i = right->count(); i >= 0; --i) {
      right->init_child(i + to_move, right->child(i));
      right->clear_child(i);
    }
    for (int i = 1; i <= to_move; ++i) {
      right->init_child(i - 1, child(count() - to_move + i));
      clear_child(count() - to_move + i);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() - to_move);
  right->set_count(right->count() + to_move);
}